

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void * utf8dup(void *src)

{
  size_t __size;
  void *pvVar1;
  long lVar2;
  
  __size = utf8size(src);
  pvVar1 = malloc(__size);
  if (pvVar1 != (void *)0x0) {
    for (lVar2 = 0; *(char *)((long)src + lVar2) != '\0'; lVar2 = lVar2 + 1) {
      *(char *)((long)pvVar1 + lVar2) = *(char *)((long)src + lVar2);
    }
    *(undefined1 *)((long)pvVar1 + lVar2) = 0;
  }
  return pvVar1;
}

Assistant:

void *utf8dup(const void *src) {
  const char *s = (const char *)src;
  char *n = 0;

  // figure out how many bytes (including the terminator) we need to copy first
  size_t bytes = utf8size(src);

  n = (char *)malloc(bytes);

  if (0 == n) {
    // out of memory so we bail
    return 0;
  } else {
    bytes = 0;

    // copy src byte-by-byte into our new utf8 string
    while ('\0' != s[bytes]) {
      n[bytes] = s[bytes];
      bytes++;
    }

    // append null terminating byte
    n[bytes] = '\0';
    return n;
  }
}